

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O0

void __thiscall
EnvironmentMap::create_images
          (EnvironmentMap *this,shared_ptr<myvk::CommandPool> *command_pool,HdrImg *img,
          vector<double,_std::allocator<double>_> *weights_ptr)

{
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkBufferImageCopy> __l_00;
  initializer_list<VkBufferImageCopy> __l_01;
  initializer_list<VkImageMemoryBarrier> __l_02;
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  CommandBuffer *this_00;
  element_type *memory_barriers;
  element_type *peVar3;
  undefined8 in_RCX;
  int *in_RDX;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  VkBufferImageCopy region;
  shared_ptr<myvk::Buffer> alias_table_image_staging;
  shared_ptr<myvk::Buffer> hdr_image_staging;
  shared_ptr<myvk::Device> *device;
  VkDeviceSize img_bytes;
  uint32_t img_size;
  shared_ptr<myvk::Image> *psVar4;
  shared_ptr<myvk::Buffer> *__r;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffa14;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffa1c;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *in_stack_fffffffffffffa20;
  Fence *this_01;
  undefined8 in_stack_fffffffffffffa28;
  VkImageLayout VVar7;
  CommandBuffer *in_stack_fffffffffffffa30;
  VkImageLayout layout;
  VkBufferImageCopy *in_stack_fffffffffffffa38;
  VkBufferImageCopy *region_00;
  ImageBase *in_stack_fffffffffffffa40;
  ImageBase *this_02;
  Ptr<BufferBase> *in_stack_fffffffffffffa48;
  VkImageLayout in_stack_fffffffffffffa50;
  VkImageLayout new_layout;
  undefined4 in_stack_fffffffffffffa54;
  undefined4 uVar8;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_fffffffffffffa58;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *buffer_memory_barriers;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *in_stack_fffffffffffffa60;
  Ptr<ImageBase> *in_stack_fffffffffffffa68;
  allocator<VkBufferImageCopy> *paVar9;
  CommandBuffer *this_03;
  undefined8 in_stack_fffffffffffffa80;
  VkFenceCreateFlags usage;
  Ptr<Device> *in_stack_fffffffffffffa88;
  undefined8 uVar10;
  VkExtent2D *in_stack_fffffffffffffa90;
  VkCommandBufferLevel level;
  undefined8 uVar11;
  Ptr<Device> *in_stack_fffffffffffffa98;
  Ptr<CommandPool> *command_pool_00;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffab0;
  Fence local_4c1;
  undefined1 local_478 [72];
  undefined1 *local_430;
  undefined8 local_428;
  VkBufferImageCopy *local_408;
  ImageBase *pIStack_400;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined1 local_3c9 [25];
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined1 *local_388;
  undefined8 local_380;
  allocator<VkBufferImageCopy> local_339;
  undefined8 local_338 [2];
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  CommandBuffer local_2b1 [3];
  undefined1 *local_220;
  undefined8 local_218;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  int local_1a0;
  int iStack_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 uStack_190;
  undefined4 local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined4 uStack_160;
  int iStack_15c;
  int iStack_158;
  undefined4 uStack_154;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  shared_ptr<myvk::Image> local_c8;
  undefined8 local_b8;
  int local_b0;
  int local_ac;
  shared_ptr<myvk::Image> local_68;
  undefined8 local_58;
  int local_50;
  int local_4c;
  Ptr<CommandPool> *local_38;
  long local_30;
  uint local_24;
  undefined8 local_20;
  int *local_18;
  
  VVar7 = (VkImageLayout)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  usage = (VkFenceCreateFlags)((ulong)in_stack_fffffffffffffa80 >> 0x20);
  local_24 = *in_RDX * in_RDX[1];
  local_30 = (ulong)local_24 << 4;
  local_20 = in_RCX;
  local_18 = in_RDX;
  peVar2 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x168f1e);
  iVar1 = (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_38 = (Ptr<CommandPool> *)CONCAT44(extraout_var,iVar1);
  local_50 = *local_18;
  local_4c = local_18[1];
  local_68.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_68.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = 0;
  psVar4 = &local_68;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x168f91);
  myvk::Image::CreateTexture2D
            (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             (uint32_t)((ulong)in_stack_fffffffffffffa88 >> 0x20),
             (VkFormat)in_stack_fffffffffffffa88,usage,in_stack_fffffffffffffab0);
  std::shared_ptr<myvk::Image>::operator=
            ((shared_ptr<myvk::Image> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),psVar4);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x169005);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffa20);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),psVar4);
  myvk::ImageView::Create
            (in_stack_fffffffffffffa68,(VkImageViewType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
             (VkImageAspectFlags)in_stack_fffffffffffffa60);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
             (shared_ptr<myvk::ImageView> *)psVar4);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x16907b);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x169088);
  local_b0 = *local_18;
  local_ac = local_18[1];
  local_c8.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_c8.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8 = 0;
  psVar4 = &local_c8;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1690e7);
  myvk::Image::CreateTexture2D
            (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             (uint32_t)((ulong)in_stack_fffffffffffffa88 >> 0x20),
             (VkFormat)in_stack_fffffffffffffa88,usage,in_stack_fffffffffffffab0);
  level = (VkCommandBufferLevel)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  std::shared_ptr<myvk::Image>::operator=
            ((shared_ptr<myvk::Image> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),psVar4);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x16915b);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffa20);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),psVar4);
  myvk::ImageView::Create
            (in_stack_fffffffffffffa68,(VkImageViewType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
             (VkImageAspectFlags)in_stack_fffffffffffffa60);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
             (shared_ptr<myvk::ImageView> *)psVar4);
  uVar6 = (undefined4)((ulong)psVar4 >> 0x20);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x1691d1);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x1691de);
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x169244);
  myvk::Buffer::CreateStaging<float*>
            ((Ptr<Device> *)in_stack_fffffffffffffa48,(float *)in_stack_fffffffffffffa40,
             (float *)in_stack_fffffffffffffa38,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffa30);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffa20);
  this_00 = (CommandBuffer *)(ulong)local_24;
  local_130 = local_20;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  command_pool_00 = local_38;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1692db);
  myvk::Buffer::
  CreateStaging<EnvironmentMap::AliasPair,EnvironmentMap::create_images(std::shared_ptr<myvk::CommandPool>const&,EnvironmentMap::HdrImg_const&,std::vector<double,std::allocator<double>>*)::__0>
            ((Ptr<Device> *)in_stack_fffffffffffffa58,
             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
             (anon_class_8_1_8e7fe40a *)in_stack_fffffffffffffa48,
             SUB81((ulong)in_stack_fffffffffffffa40 >> 0x38,0),
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffa38);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffa20);
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 1;
  uStack_170 = 0x100000000;
  local_194 = 0;
  uStack_190 = 0;
  local_18c = 0;
  uStack_160 = 0;
  local_168 = 0;
  local_1a0 = *local_18;
  iStack_19c = local_18[1];
  local_198 = 1;
  uStack_154 = 1;
  iStack_15c = local_1a0;
  iStack_158 = iStack_19c;
  myvk::CommandBuffer::Create(command_pool_00,level);
  myvk::Fence::Create(in_stack_fffffffffffffa88,usage);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16945c);
  myvk::CommandBuffer::Begin(in_stack_fffffffffffffa30,VVar7);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169478);
  uVar10 = 0;
  uVar11 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x1694a9);
  local_1e8 = 0;
  local_1f8 = uVar10;
  uStack_1f0 = uVar11;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x1694d2);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1694e3)
  ;
  myvk::ImageBase::GetDstMemoryBarrier
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffffa30,VVar7,in_stack_fffffffffffffa50,
             (uint32_t)in_stack_fffffffffffffa58,(uint32_t)in_stack_fffffffffffffa60);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16953e)
  ;
  uVar5 = 0xffffffff;
  __r = (shared_ptr<myvk::Buffer> *)CONCAT44(uVar6,7);
  myvk::ImageBase::GetDstMemoryBarrier
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffffa30,VVar7,in_stack_fffffffffffffa50,
             (uint32_t)in_stack_fffffffffffffa58,(uint32_t)in_stack_fffffffffffffa60);
  layout = (VkImageLayout)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  local_220 = (undefined1 *)((long)&local_2b1[0].super_DeviceObjectBase.super_Base._vptr_Base + 1);
  local_218 = 2;
  this_03 = local_2b1;
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x1695a6);
  __l._M_len._0_4_ = in_stack_fffffffffffffa50;
  __l._M_array = (iterator)in_stack_fffffffffffffa48;
  __l._M_len._4_4_ = in_stack_fffffffffffffa54;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffa40,__l,(allocator_type *)in_stack_fffffffffffffa38);
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_03,(VkPipelineStageFlags)((ulong)in_stack_fffffffffffffa68 >> 0x20),
             (VkPipelineStageFlags)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffa20);
  std::allocator<VkImageMemoryBarrier>::~allocator((allocator<VkImageMemoryBarrier> *)local_2b1);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffffa20);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffa20)
  ;
  memory_barriers =
       std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)0x169639);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)CONCAT44(in_stack_fffffffffffffa14,uVar5),__r);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffa14,uVar5),
             (shared_ptr<myvk::Image> *)__r);
  local_308 = CONCAT44(uStack_154,iStack_158);
  uStack_310 = CONCAT44(iStack_15c,uStack_160);
  local_318 = local_168;
  local_328 = local_178;
  uStack_320 = uStack_170;
  local_338[0] = local_188;
  local_338[1] = uStack_180;
  local_300 = local_338;
  local_2f8 = 1;
  paVar9 = &local_339;
  std::allocator<VkBufferImageCopy>::allocator((allocator<VkBufferImageCopy> *)0x1696da);
  __l_00._M_len._0_4_ = in_stack_fffffffffffffa50;
  __l_00._M_array = (iterator)in_stack_fffffffffffffa48;
  __l_00._M_len._4_4_ = in_stack_fffffffffffffa54;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffa40,__l_00,(allocator_type *)in_stack_fffffffffffffa38);
  myvk::CommandBuffer::CmdCopy
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
             in_stack_fffffffffffffa48,(Ptr<ImageBase> *)in_stack_fffffffffffffa40,
             (vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffa38,layout);
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::~vector
            (in_stack_fffffffffffffa20);
  std::allocator<VkBufferImageCopy>::~allocator(&local_339);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16974f);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x16975c);
  peVar3 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x169769);
  new_layout = (VkImageLayout)peVar3;
  uVar8 = (undefined4)((ulong)peVar3 >> 0x20);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)CONCAT44(in_stack_fffffffffffffa14,uVar5),__r);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffa14,uVar5),
             (shared_ptr<myvk::Image> *)__r);
  local_398 = CONCAT44(uStack_154,iStack_158);
  uStack_3a0 = CONCAT44(iStack_15c,uStack_160);
  local_3a8 = local_168;
  local_3c9._17_8_ = local_178;
  uStack_3b0 = uStack_170;
  local_3c9._1_8_ = local_188;
  local_3c9._9_8_ = uStack_180;
  local_388 = local_3c9 + 1;
  local_380 = 1;
  buffer_memory_barriers =
       (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)local_3c9;
  std::allocator<VkBufferImageCopy>::allocator((allocator<VkBufferImageCopy> *)0x16980a);
  __l_01._M_len._0_4_ = new_layout;
  __l_01._M_array = (iterator)in_stack_fffffffffffffa48;
  __l_01._M_len._4_4_ = uVar8;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffa40,__l_01,(allocator_type *)in_stack_fffffffffffffa38);
  myvk::CommandBuffer::CmdCopy
            ((CommandBuffer *)CONCAT44(uVar8,new_layout),in_stack_fffffffffffffa48,
             (Ptr<ImageBase> *)in_stack_fffffffffffffa40,
             (vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffa38,layout);
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::~vector
            (in_stack_fffffffffffffa20);
  std::allocator<VkBufferImageCopy>::~allocator((allocator<VkBufferImageCopy> *)local_3c9);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16987f);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x16988c);
  peVar3 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x169899);
  region_00 = (VkBufferImageCopy *)0x0;
  this_02 = (ImageBase *)0x0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3d8 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x1698c7);
  local_3f8 = 0;
  local_408 = region_00;
  pIStack_400 = this_02;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x1698ed);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1698fe)
  ;
  myvk::ImageBase::GetDstMemoryBarrier
            (this_02,region_00,(VkAccessFlags)((ulong)peVar3 >> 0x20),(VkAccessFlags)peVar3,VVar7,
             new_layout,(uint32_t)buffer_memory_barriers,(uint32_t)memory_barriers);
  VVar7 = (VkImageLayout)((ulong)local_478 >> 0x20);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16995b)
  ;
  uVar6 = 0xffffffff;
  myvk::ImageBase::GetDstMemoryBarrier
            (this_02,region_00,(VkAccessFlags)((ulong)peVar3 >> 0x20),(VkAccessFlags)peVar3,VVar7,
             new_layout,(uint32_t)buffer_memory_barriers,(uint32_t)memory_barriers);
  local_430 = (undefined1 *)((long)&local_4c1.super_DeviceObjectBase.super_Base._vptr_Base + 1);
  local_428 = 2;
  this_01 = &local_4c1;
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x1699c5);
  __l_02._M_len._0_4_ = new_layout;
  __l_02._M_array = (iterator)in_stack_fffffffffffffa48;
  __l_02._M_len._4_4_ = uVar8;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)this_02,__l_02,
             (allocator_type *)region_00);
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_03,(VkPipelineStageFlags)((ulong)paVar9 >> 0x20),(VkPipelineStageFlags)paVar9,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)memory_barriers,
             buffer_memory_barriers,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(uVar8,new_layout));
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)this_01);
  std::allocator<VkImageMemoryBarrier>::~allocator((allocator<VkImageMemoryBarrier> *)&local_4c1);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)this_01);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)this_01);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169a58);
  myvk::CommandBuffer::End((CommandBuffer *)0x169a60);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169a6f);
  myvk::CommandBuffer::Submit(this_00,(Ptr<Fence> *)command_pool_00);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x169a8e)
  ;
  myvk::Fence::Wait(this_01,CONCAT44(in_stack_fffffffffffffa1c,uVar6));
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x169aac);
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x169ab9);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x169ac6);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x169ad3);
  return;
}

Assistant:

void EnvironmentMap::create_images(const std::shared_ptr<myvk::CommandPool> &command_pool, const HdrImg &img,
                                   std::vector<double> *weights_ptr) {
	const uint32_t img_size = img.m_width * img.m_height;
	const VkDeviceSize img_bytes = img_size * sizeof(float) * 4;

	const std::shared_ptr<myvk::Device> &device = command_pool->GetDevicePtr();

	// create vulkan objects
	m_hdr_image = myvk::Image::CreateTexture2D(device, {img.m_width, img.m_height}, 1, VK_FORMAT_R32G32B32A32_SFLOAT,
	                                           VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT);
	m_hdr_image_view = myvk::ImageView::Create(m_hdr_image, VK_IMAGE_VIEW_TYPE_2D);
	m_alias_table_image = myvk::Image::CreateTexture2D(device, {img.m_width, img.m_height}, 1, VK_FORMAT_R32G32_UINT,
	                                                   VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT);
	m_alias_table_image_view = myvk::ImageView::Create(m_alias_table_image, VK_IMAGE_VIEW_TYPE_2D);

	// create and fill staging objects
	std::shared_ptr<myvk::Buffer> hdr_image_staging =
	    myvk::Buffer::CreateStaging(device, img.m_data, img.m_data + img_size * 4);

	std::shared_ptr<myvk::Buffer> alias_table_image_staging = myvk::Buffer::CreateStaging<AliasPair>(
	    device, img_size, [weights_ptr](AliasPair *data) { generate_alias_table(weights_ptr, data); });

	// copy data
	VkBufferImageCopy region = {};
	region.bufferOffset = 0;
	region.bufferRowLength = 0;
	region.bufferImageHeight = 0;
	region.imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
	region.imageSubresource.mipLevel = 0;
	region.imageSubresource.baseArrayLayer = 0;
	region.imageSubresource.layerCount = 1;
	region.imageOffset = {0, 0, 0};
	region.imageExtent = {img.m_width, img.m_height, 1};

	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_hdr_image->GetDstMemoryBarrier(region, 0, VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_alias_table_image->GetDstMemoryBarrier(region, 0, VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
	                                              VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});
	command_buffer->CmdCopy(hdr_image_staging, m_hdr_image, {region});
	command_buffer->CmdCopy(alias_table_image_staging, m_alias_table_image, {region});
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {
	        m_hdr_image->GetDstMemoryBarrier(region, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                         VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	                                         VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	        m_alias_table_image->GetDstMemoryBarrier(region, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                                 VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	                                                 VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	    });
	command_buffer->End();

	command_buffer->Submit(fence);
	fence->Wait();
}